

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::resize(Buffer *this,off_t minSize)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (this->capacity_ <= minSize) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < minSize) {
      uVar4 = minSize;
    }
    pcVar3 = (char *)operator_new__(uVar4);
    lVar1 = this->leftIndex_;
    if (this->rightIndex_ < lVar1) {
      __assert_fail("rightIndex_ >= leftIndex_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                    ,0x5a,"off_t Liby::Buffer::size() const");
    }
    pcVar2 = this->buffer_;
    memcpy(pcVar3 + lVar1,pcVar2 + lVar1,this->rightIndex_ - lVar1);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    this->buffer_ = pcVar3;
    this->capacity_ = minSize;
  }
  return;
}

Assistant:

void Buffer::resize(off_t minSize) {
    if (minSize < capacity_)
        return;
    char *newBuffer = new char[minSize];
    ::memcpy(newBuffer + leftIndex_, buffer_ + leftIndex_, size());
    delete[] buffer_;
    buffer_ = newBuffer;
    capacity_ = minSize;
}